

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 __thiscall glcts::Blend(glcts *this,Vec4 *rgb,Vec4 *src,Vec4 *dst)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  Vec4 VVar6;
  Vec4 rgbOut;
  Vector<float,_4> res_3;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vector<float,_4> res_2;
  
  fVar1 = src->m_data[3];
  fVar2 = dst->m_data[3];
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = rgb->m_data[lVar3] * fVar1 * fVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  fVar5 = fVar1 * (1.0 - fVar2);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3] = src->m_data[lVar3] * fVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = res.m_data[lVar3] + res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  fVar4 = fVar2 * (1.0 - fVar1);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  res_3.m_data[2] = 0.0;
  res_3.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    res_3.m_data[lVar3] = dst->m_data[lVar3] * fVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  rgbOut.m_data[0] = 0.0;
  rgbOut.m_data[1] = 0.0;
  rgbOut.m_data[2] = 0.0;
  rgbOut.m_data[3] = 0.0;
  lVar3 = 0;
  do {
    rgbOut.m_data[lVar3] = res_2.m_data[lVar3] + res_3.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  VVar6.m_data[0] = fVar4 + fVar1 * fVar2 + fVar5;
  VVar6.m_data[1] = 0.0;
  *(undefined8 *)this = rgbOut.m_data._0_8_;
  *(float *)(this + 8) = rgbOut.m_data[2];
  *(float *)(this + 0xc) = VVar6.m_data[0];
  VVar6.m_data[2] = rgbOut.m_data[2];
  VVar6.m_data[3] = 0.0;
  return (Vec4)VVar6.m_data;
}

Assistant:

static tcu::Vec4 Blend(const tcu::Vec4& rgb, const tcu::Vec4& src, const tcu::Vec4& dst)
{
	float	 p[3]   = { GetP0(src, dst), GetP1(src, dst), GetP2(src, dst) };
	float	 alpha  = p[0] + p[1] + p[2];
	tcu::Vec4 rgbOut = (p[0] * rgb) + (p[1] * src) + (p[2] * dst);
	return tcu::Vec4(rgbOut[0], rgbOut[1], rgbOut[2], alpha);
}